

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall RandomBotStrategy::intInput(RandomBotStrategy *this,StrategyContext context)

{
  long lVar1;
  int *piVar2;
  undefined8 *puVar3;
  param_type *ppVar4;
  param_type *ppVar5;
  byte bVar6;
  param_type apStack_d828 [626];
  int local_c494;
  void *local_c490;
  ostream *local_c488;
  result_type_conflict local_c47c;
  param_type *local_c478;
  int local_c470;
  int local_c46c;
  undefined8 *local_c468;
  int local_c45c;
  undefined8 *local_c458;
  int local_c44c;
  reference local_c448;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *local_c440;
  undefined8 *local_c438;
  int local_c42c;
  reference local_c428;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *local_c420;
  undefined8 *local_c418;
  int local_c40c;
  result_type_conflict local_c408;
  int local_c404;
  int *local_c400;
  int local_c3f4;
  reference local_c3f0;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *local_c3e8;
  undefined8 *local_c3e0;
  int local_c3d4;
  reference local_c3d0;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *local_c3c8;
  undefined8 *local_c3c0;
  int local_c3b4;
  ulong local_c3b0;
  RandomBotStrategy *local_c3a8;
  size_t *local_c3a0;
  result_type_conflict1 local_c394;
  uniform_int_distribution<int> local_c390;
  uniform_int_distribution<int> dis_1;
  undefined8 local_b000 [625];
  undefined8 local_9c78 [625];
  undefined8 local_88f0 [625];
  undefined8 local_7568 [625];
  uniform_int_distribution<int> local_61dc;
  uniform_int_distribution<int> dis;
  int maxDice;
  undefined8 local_4e48 [625];
  undefined8 local_3ac0 [627];
  undefined1 local_2728 [8];
  mt19937 gen;
  random_device rd;
  int userInput;
  StrategyContext context_local;
  RandomBotStrategy *this_local;
  
  bVar6 = 0;
  rd.field_0._M_mt._M_p._0_4_ = 0;
  local_c3a0 = &gen._M_p;
  local_c3a8 = this;
  std::random_device::random_device((random_device *)local_c3a0);
  local_c394 = std::random_device::operator()((random_device *)local_c3a0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2728,(ulong)local_c394);
  local_c3b0 = (ulong)(context - ATTACK_FROM_COUNTRY);
  switch(local_c3b0) {
  case 0:
    local_c3c0 = local_3ac0;
    memcpy(local_c3c0,local_2728,5000);
    puVar3 = local_c3c0;
    ppVar4 = apStack_d828;
    for (lVar1 = 0x271; lVar1 != 0; lVar1 = lVar1 + -1) {
      *ppVar4 = (param_type)*puVar3;
      puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
      ppVar4 = ppVar4 + (ulong)bVar6 * -2 + 1;
    }
    rd.field_0._M_mt._M_p._0_4_ = chooseRandomCountry(local_c3a8);
    local_c3b4 = rd.field_0._M_mt._M_p._0_4_;
    local_c3c8 = Player::getOwnedCountries((local_c3a8->super_PlayerStrategy).player);
    local_c3d0 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                           (local_c3c8,(long)(int)rd.field_0._M_mt._M_p._0_4_);
    (local_c3a8->super_PlayerStrategy).from = *local_c3d0;
    break;
  case 1:
    local_c3e0 = local_4e48;
    memcpy(local_c3e0,local_2728,5000);
    puVar3 = local_c3e0;
    ppVar4 = apStack_d828;
    for (lVar1 = 0x271; lVar1 != 0; lVar1 = lVar1 + -1) {
      *ppVar4 = (param_type)*puVar3;
      puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
      ppVar4 = ppVar4 + (ulong)bVar6 * -2 + 1;
    }
    rd.field_0._M_mt._M_p._0_4_ = chooseRandomNeighbour(local_c3a8);
    local_c3d4 = rd.field_0._M_mt._M_p._0_4_;
    local_c3e8 = Map::Country::getAdjCountries((local_c3a8->super_PlayerStrategy).from);
    local_c3f0 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                           (local_c3e8,(long)(int)rd.field_0._M_mt._M_p._0_4_);
    (local_c3a8->super_PlayerStrategy).to = *local_c3f0;
    break;
  case 2:
    local_c400 = &dis._M_param._M_b;
    memcpy(local_c400,local_2728,5000);
    piVar2 = local_c400;
    ppVar4 = apStack_d828;
    for (lVar1 = 0x271; lVar1 != 0; lVar1 = lVar1 + -1) {
      *ppVar4 = (param_type)*(undefined8 *)piVar2;
      piVar2 = piVar2 + (ulong)bVar6 * -4 + 2;
      ppVar4 = ppVar4 + (ulong)bVar6 * -2 + 1;
    }
    local_c3f4 = attackMaxDice(local_c3a8);
    rd.field_0._M_mt._M_p._0_4_ = local_c3f4;
    break;
  case 3:
    local_c468 = local_b000;
    memcpy(local_c468,local_2728,5000);
    puVar3 = local_c468;
    ppVar4 = apStack_d828;
    for (lVar1 = 0x271; lVar1 != 0; lVar1 = lVar1 + -1) {
      *ppVar4 = (param_type)*puVar3;
      puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
      ppVar4 = ppVar4 + (ulong)bVar6 * -2 + 1;
    }
    local_c45c = sendRandomArmies(local_c3a8);
    rd.field_0._M_mt._M_p._0_4_ = local_c45c;
    break;
  case 4:
    local_c404 = Map::Country::getNumberOfTroops((local_c3a8->super_PlayerStrategy).to);
    dis._M_param._M_a = (1 < local_c404) + 1;
    std::uniform_int_distribution<int>::uniform_int_distribution(&local_61dc,1,dis._M_param._M_a);
    local_c408 = std::uniform_int_distribution<int>::operator()
                           (&local_61dc,
                            (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_2728);
    rd.field_0._M_mt._M_p._0_4_ = local_c408;
    break;
  case 6:
    local_c418 = local_7568;
    memcpy(local_c418,local_2728,5000);
    puVar3 = local_c418;
    ppVar4 = apStack_d828;
    for (lVar1 = 0x271; lVar1 != 0; lVar1 = lVar1 + -1) {
      *ppVar4 = (param_type)*puVar3;
      puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
      ppVar4 = ppVar4 + (ulong)bVar6 * -2 + 1;
    }
    rd.field_0._M_mt._M_p._0_4_ = chooseRandomCountry(local_c3a8);
    local_c40c = rd.field_0._M_mt._M_p._0_4_;
    local_c420 = Player::getOwnedCountries((local_c3a8->super_PlayerStrategy).player);
    local_c428 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                           (local_c420,(long)(int)rd.field_0._M_mt._M_p._0_4_);
    (local_c3a8->super_PlayerStrategy).from = *local_c428;
    break;
  case 7:
    local_c438 = local_88f0;
    memcpy(local_c438,local_2728,5000);
    puVar3 = local_c438;
    ppVar4 = apStack_d828;
    for (lVar1 = 0x271; lVar1 != 0; lVar1 = lVar1 + -1) {
      *ppVar4 = (param_type)*puVar3;
      puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
      ppVar4 = ppVar4 + (ulong)bVar6 * -2 + 1;
    }
    rd.field_0._M_mt._M_p._0_4_ = chooseRandomNeighbour(local_c3a8);
    local_c42c = rd.field_0._M_mt._M_p._0_4_;
    local_c440 = Map::Country::getAdjCountries((local_c3a8->super_PlayerStrategy).from);
    local_c448 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                           (local_c440,(long)(int)rd.field_0._M_mt._M_p._0_4_);
    (local_c3a8->super_PlayerStrategy).to = *local_c448;
    break;
  case 8:
    local_c458 = local_9c78;
    memcpy(local_c458,local_2728,5000);
    puVar3 = local_c458;
    ppVar4 = apStack_d828;
    for (lVar1 = 0x271; lVar1 != 0; lVar1 = lVar1 + -1) {
      *ppVar4 = (param_type)*puVar3;
      puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
      ppVar4 = ppVar4 + (ulong)bVar6 * -2 + 1;
    }
    local_c44c = sendRandomArmies(local_c3a8);
    rd.field_0._M_mt._M_p._0_4_ = local_c44c;
    break;
  case 10:
    local_c478 = &dis_1._M_param;
    memcpy(local_c478,local_2728,5000);
    local_c470 = *(local_c3a8->super_PlayerStrategy).exchangingCardType;
    ppVar4 = local_c478;
    ppVar5 = apStack_d828;
    for (lVar1 = 0x271; lVar1 != 0; lVar1 = lVar1 + -1) {
      *ppVar5 = *ppVar4;
      ppVar4 = ppVar4 + (ulong)bVar6 * -2 + 1;
      ppVar5 = ppVar5 + (ulong)bVar6 * -2 + 1;
    }
    local_c46c = reinforceMaxCards(local_c3a8,local_c470);
    rd.field_0._M_mt._M_p._0_4_ = local_c46c;
    break;
  case 0xb:
    std::uniform_int_distribution<int>::uniform_int_distribution
              (&local_c390,0,*(local_c3a8->super_PlayerStrategy).armiesToPlace);
    local_c47c = std::uniform_int_distribution<int>::operator()
                           (&local_c390,
                            (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_2728);
    rd.field_0._M_mt._M_p._0_4_ = local_c47c;
  }
  local_c488 = std::operator<<((ostream *)&std::cout," ");
  local_c490 = (void *)std::ostream::operator<<(local_c488,rd.field_0._M_mt._M_p._0_4_);
  std::ostream::operator<<(local_c490,std::endl<char,std::char_traits<char>>);
  local_c494 = rd.field_0._M_mt._M_p._0_4_;
  std::random_device::~random_device((random_device *)&gen._M_p);
  return local_c494;
}

Assistant:

int RandomBotStrategy::intInput(StrategyContext context) {
    int userInput = 0;
    std::random_device rd; // random number generator
    std::mt19937 gen(rd()); // seed the generator
    switch((int) context) {
        case StrategyContext::ATTACK_FROM_COUNTRY: {
            userInput = RandomBotStrategy::chooseRandomCountry(gen);
            from = player->getOwnedCountries()->at(userInput);
        } break;
        case StrategyContext::ATTACK_TO_COUNTRY: {
            userInput = RandomBotStrategy::chooseRandomNeighbour(gen);
            to = from->getAdjCountries()->at(userInput);
        } break;
        case StrategyContext::ATTACK_DICE_COUNT: {
            userInput = RandomBotStrategy::attackMaxDice(gen);
        } break;
        case StrategyContext::DEFEND_DICE_COUNT: {
            int maxDice = (to->getNumberOfTroops() >= 2) ? 2 : 1;
            std::uniform_int_distribution<> dis(1, maxDice);
            userInput = dis(gen);
        } break;
        case StrategyContext::FORTIFY_FROM_COUNTRY: {
            userInput = RandomBotStrategy::chooseRandomCountry(gen);
            from = player->getOwnedCountries()->at(userInput);
        } break;
        case StrategyContext::FORTIFY_TO_COUNTRY: {
            userInput = RandomBotStrategy::chooseRandomNeighbour(gen);
            to = from->getAdjCountries()->at(userInput);
        } break;
        case StrategyContext::FORTIFY_ARMY_COUNT: {
            userInput = RandomBotStrategy::sendRandomArmies(gen);
        } break;
        case StrategyContext::ATTACK_NEW_ARMY_COUNT: {
            userInput = RandomBotStrategy::sendRandomArmies(gen);
        } break;
        case StrategyContext::REINFORCE_CARD_COUNT: {
            userInput = RandomBotStrategy::reinforceMaxCards(gen, *exchangingCardType);
        } break;
        case StrategyContext::REINFORCE_ARMY_COUNT: {
            std::uniform_int_distribution<> dis(0, *armiesToPlace);
            userInput = dis(gen);
        }
    }
    std::cout << " " << userInput << std::endl;
    return userInput;
}